

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O0

void __thiscall Assimp::ZipArchiveIOSystem::Implement::MapArchive(Implement *this)

{
  uLong uVar1;
  bool bVar2;
  int iVar3;
  ZipFileInfo local_1f0;
  allocator local_1c1;
  undefined1 local_1c0 [8];
  string filename_string;
  unz_file_info fileInfo;
  char filename [256];
  Implement *this_local;
  
  if (((this->m_ZipFileHandle != (unzFile)0x0) &&
      (bVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::ZipFileInfo>_>_>
               ::empty(&this->m_ArchiveMap), bVar2)) &&
     (iVar3 = unzGoToFirstFile(this->m_ZipFileHandle), iVar3 == 0)) {
    do {
      iVar3 = unzGetCurrentFileInfo
                        (this->m_ZipFileHandle,(undefined1 *)((long)&filename_string.field_2 + 8),
                         &fileInfo.tmu_date.tm_mon,0x100,0,0,0,0);
      uVar1 = fileInfo.uncompressed_size;
      if ((iVar3 == 0) && (fileInfo.compressed_size != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_1c0,(char *)&fileInfo.tmu_date.tm_mon,uVar1,&local_1c1);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        SimplifyFilename((string *)local_1c0);
        ZipFileInfo::ZipFileInfo(&local_1f0,this->m_ZipFileHandle,fileInfo.compressed_size);
        std::
        map<std::__cxx11::string,Assimp::ZipFileInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::ZipFileInfo>>>
        ::emplace<std::__cxx11::string&,Assimp::ZipFileInfo>
                  ((map<std::__cxx11::string,Assimp::ZipFileInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::ZipFileInfo>>>
                    *)&this->m_ArchiveMap,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                   &local_1f0);
        std::__cxx11::string::~string((string *)local_1c0);
      }
      iVar3 = unzGoToNextFile(this->m_ZipFileHandle);
    } while (iVar3 != -100);
  }
  return;
}

Assistant:

void ZipArchiveIOSystem::Implement::MapArchive() {
        if (m_ZipFileHandle == nullptr)
            return;

        if (!m_ArchiveMap.empty())
            return;

        //  At first ensure file is already open
        if (unzGoToFirstFile(m_ZipFileHandle) != UNZ_OK)
            return;

        // Loop over all files
        do {
            char filename[FileNameSize];
            unz_file_info fileInfo;

            if (unzGetCurrentFileInfo(m_ZipFileHandle, &fileInfo, filename, FileNameSize, nullptr, 0, nullptr, 0) == UNZ_OK) {
                if (fileInfo.uncompressed_size != 0) {
                    std::string filename_string(filename, fileInfo.size_filename);
                    SimplifyFilename(filename_string);
                    m_ArchiveMap.emplace(filename_string, ZipFileInfo(m_ZipFileHandle, fileInfo.uncompressed_size));
                }
            }
        } while (unzGoToNextFile(m_ZipFileHandle) != UNZ_END_OF_LIST_OF_FILE);
    }